

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[9],std::__cxx11::string,char>
          (JObject *this,char (*k) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_48;
  undefined1 local_38 [8];
  Field<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  field;
  char *c_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  char (*k_local) [9];
  JObject *this_local;
  
  field.v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c;
  Field<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Field((Field<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[9],std::__cxx11::string>,char>
                       ((Field<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }